

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O1

bool __thiscall
ParsePackage::ParseFuncCall
          (ParsePackage *this,char *buf,int len,string *func_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_str_map,vector<cppnet::Any,_std::allocator<cppnet::Any>_> *res)

{
  char *pcVar1;
  _Rep_type *p_Var2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  const_iterator cVar8;
  ParsePackage *this_00;
  ParsePackage *pPVar9;
  string func_str;
  int local_74;
  long local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  vector<cppnet::Any,_std::allocator<cppnet::Any>_> *local_48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  string *local_38;
  
  if (buf == (char *)0x0) {
    return false;
  }
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  local_48 = res;
  local_40 = &func_str_map->_M_t;
  local_38 = func_name;
  iVar5 = strcmp(buf,"\r\n\r\n");
  bVar4 = true;
  if (iVar5 != 0) {
    pPVar9 = (ParsePackage *)(buf + len);
    p_Var2 = (_Rep_type *)&local_40->_M_impl;
    iVar5 = 2;
    local_70 = 0;
    local_74 = 0;
LAB_0010a889:
    if ((pPVar9 < buf) ||
       (this_00 = (ParsePackage *)buf, pcVar7 = strchr(buf,0x7c), psVar3 = local_38,
       pcVar7 == (char *)0x0)) goto LAB_0010aa04;
    *pcVar7 = '\0';
    if (iVar5 != 4) {
      if (iVar5 == 3) {
        local_74 = atoi(buf);
        iVar5 = 4;
      }
      else {
        pcVar1 = (char *)local_38->_M_string_length;
        strlen(buf);
        std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar1,(ulong)buf);
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(local_40,local_38);
        if ((_Rb_tree_header *)cVar8._M_node == &(p_Var2->_M_impl).super__Rb_tree_header)
        goto LAB_0010aa04;
        std::__cxx11::string::_M_assign((string *)&local_68);
        local_70 = std::__cxx11::string::find((char *)&local_68,0x1222e6,0);
        local_70 = local_70 + 1;
        iVar5 = 3;
      }
LAB_0010a9dc:
      buf = pcVar7 + 1;
      iVar6 = strcmp(buf,"\r\n\r\n");
      if (iVar6 == 0) goto LAB_0010a9f5;
      goto LAB_0010a889;
    }
    if (local_68[local_70] == 'v') {
      bVar4 = _ParseVec(this_00,buf,local_68[local_70 + 1],local_48);
      if (bVar4) {
        local_70 = local_70 + 2;
LAB_0010a9a6:
        iVar5 = 4;
        local_74 = local_74 + -1;
        if (local_74 != 0) goto LAB_0010a9dc;
        if (local_68[local_70] == ')') goto LAB_0010a9f5;
        local_74 = 0;
        goto LAB_0010a9dc;
      }
    }
    else {
      bVar4 = _ParseParam(this_00,buf,local_68[local_70],local_48);
      if (bVar4) {
        local_70 = local_70 + 1;
        goto LAB_0010a9a6;
      }
    }
LAB_0010aa04:
    bVar4 = false;
  }
LAB_0010aa0c:
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return bVar4;
LAB_0010a9f5:
  bVar4 = true;
  goto LAB_0010aa0c;
}

Assistant:

bool ParsePackage::ParseFuncCall(char* buf, int len, std::string& func_name, const std::map<std::string, std::string>& func_str_map, std::vector<cppnet::Any>& res) {
    if (!buf) {
        return false;
    }
    char* end = buf + len;
    char* next = buf;
    char* pos = nullptr;
    char* cur = nullptr;

    int state = PARSE_NAME;
    int num = 0;
    std::string func_str;
    size_t index = 0;
    for (;;) {
        cur = next;
        if (strcmp(cur, "\r\n\r\n") == 0) {
            return true;
        }
        if (cur > end) {
            return false;
        }
        pos = strchr(cur, '|');
        if (pos) {
            next = pos + 1;
            *pos = '\0';

        } else {
            return false;
        }
        switch (state) {
        case PARSE_NAME:
        {
            func_name = cur;
            auto iter = func_str_map.find(func_name);
            if (iter != func_str_map.end()) {
                func_str = iter->second;
                state = PARSE_NUM;
                index = func_str.find("(") + 1;
                break;
            }
            return false;
        }
            
        case PARSE_NUM:
            num = atoi(cur);
            state = PARSE_PARAM;
            break;
        case PARSE_PARAM:
            if (func_str[index] == 'v') {
                if (_ParseVec(cur, func_str[++index], res)) {
                    num--;
                    index++;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            } else {
                if (_ParseParam(cur, func_str[index++], res)) {
                    num--;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            }
            break;
        }
    }
    return false;
}